

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal.cpp
# Opt level: O3

void __thiscall LiteScript::String::String(String *this,char *data)

{
  allocator local_31;
  string local_30;
  
  std::__cxx11::string::string((string *)&local_30,data,&local_31);
  ConvertToUnicode(&this->str,&local_30);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p);
  }
  return;
}

Assistant:

LiteScript::String::String(const char * data) : str(String::ConvertToUnicode(std::string(data))) {}